

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O2

bool __thiscall
XmlModelSerialiserPrivate::readXml(XmlModelSerialiserPrivate *this,QXmlStreamReader *reader)

{
  QAbstractItemModel *pQVar1;
  XmlModelSerialiserPrivate *pXVar2;
  byte bVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined4 uVar9;
  int type;
  byte bVar10;
  QStringView QVar11;
  QStringView rhs;
  QStringView rhs_00;
  QStringView rhs_01;
  QStringView rhs_02;
  QStringView rhs_03;
  QStringView rhs_04;
  QStringView rhs_05;
  QStringView rhs_06;
  QVariant roleVariant;
  QXmlStreamAttributes headDataAttribute;
  QArrayDataPointer<char16_t> local_c8;
  XmlModelSerialiserPrivate *local_a8;
  QArrayDataPointer<char16_t> local_a0;
  int local_88;
  int local_84;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_model;
  if (pQVar1 == (QAbstractItemModel *)0x0) {
    return false;
  }
  roleVariant.d.data._forAlignment = -NAN;
  roleVariant.d.data._8_8_ = 0;
  roleVariant.d.data._16_8_ = 0;
  uVar9 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,(QModelIndex *)&roleVariant);
  _headDataAttribute = (Data *)0xffffffffffffffff;
  (**(code **)(*(long *)pQVar1 + 0x110))
            (pQVar1,0,uVar9,(QArrayDataPointer<QXmlStreamAttribute> *)&headDataAttribute);
  pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
           m_model;
  roleVariant.d.data._forAlignment = -NAN;
  roleVariant.d.data._8_8_ = 0;
  roleVariant.d.data._16_8_ = 0;
  local_a8 = this;
  uVar9 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&roleVariant);
  _headDataAttribute = (Data *)0xffffffffffffffff;
  (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar9);
  bVar8 = false;
  bVar3 = 0;
  bVar5 = false;
LAB_0012b408:
  do {
    do {
      bVar7 = bVar5;
      bVar10 = bVar3;
      cVar4 = QXmlStreamReader::atEnd();
      if (cVar4 != '\0') {
LAB_0012baa2:
        bVar8 = QXmlStreamReader::hasError(reader);
        if (!bVar8) {
          return true;
        }
LAB_0012bab5:
        pXVar2 = local_a8;
        pQVar1 = (local_a8->super_AbstractStringSerialiserPrivate).
                 super_AbstractModelSerialiserPrivate.m_model;
        roleVariant.d.data._forAlignment = -NAN;
        roleVariant.d.data._8_8_ = 0;
        roleVariant.d.data._16_8_ = 0;
        uVar9 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&roleVariant);
        _headDataAttribute = (Data *)0xffffffffffffffff;
        (**(code **)(*(long *)pQVar1 + 0x110))(pQVar1,0,uVar9,&headDataAttribute);
        pQVar1 = (pXVar2->super_AbstractStringSerialiserPrivate).
                 super_AbstractModelSerialiserPrivate.m_model;
        roleVariant.d.data._forAlignment = -NAN;
        roleVariant.d.data._8_8_ = 0;
        roleVariant.d.data._16_8_ = 0;
        uVar9 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&roleVariant);
        _headDataAttribute = (Data *)0xffffffffffffffff;
        (**(code **)(*(long *)pQVar1 + 0x108))(pQVar1,0,uVar9,&headDataAttribute);
        return false;
      }
      bVar5 = QXmlStreamReader::hasError(reader);
      if (bVar5) goto LAB_0012baa2;
      QXmlStreamReader::readNext();
      bVar6 = QXmlStreamReader::isStartElement(reader);
      bVar3 = bVar10;
      bVar5 = bVar7;
      if (!bVar6) {
        bVar6 = QXmlStreamReader::isEndElement(reader);
        if (bVar6) {
          QVar11 = (QStringView)QXmlStreamReader::name();
          roleVariant.d.data.shared = (PrivateShared *)0x0;
          roleVariant.d.data._8_8_ = anon_var_dwarf_a7b89;
          roleVariant.d.data._16_8_ = 10;
          _headDataAttribute = (Data *)0x0;
          rhs_00.m_data = L"HeaderData";
          rhs_00.m_size = 10;
          bVar6 = ::operator==(QVar11,rhs_00);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&roleVariant);
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&headDataAttribute);
          bVar3 = 0;
          if (!bVar6) {
            QVar11 = (QStringView)QXmlStreamReader::name();
            roleVariant.d.data.shared = (PrivateShared *)0x0;
            roleVariant.d.data._8_8_ = anon_var_dwarf_a7bc9;
            roleVariant.d.data._16_8_ = 8;
            _headDataAttribute = (Data *)0x0;
            rhs_01.m_data = L"Vertical";
            rhs_01.m_size = 8;
            bVar6 = ::operator==(QVar11,rhs_01);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&roleVariant);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&headDataAttribute);
            bVar3 = bVar10;
            bVar5 = false;
            if ((bVar6 & bVar10) == 0) {
              QVar11 = (QStringView)QXmlStreamReader::name();
              roleVariant.d.data.shared = (PrivateShared *)0x0;
              roleVariant.d.data._8_8_ = anon_var_dwarf_a7b9f;
              roleVariant.d.data._16_8_ = 10;
              _headDataAttribute = (Data *)0x0;
              rhs_02.m_data = L"Horizontal";
              rhs_02.m_size = 10;
              bVar6 = ::operator==(QVar11,rhs_02);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&roleVariant);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&headDataAttribute);
              bVar5 = bVar7;
              if ((bVar6 & bVar10) != 0) {
                bVar8 = false;
              }
            }
          }
        }
        goto LAB_0012b408;
      }
      QVar11 = (QStringView)QXmlStreamReader::name();
      roleVariant.d.data.shared = (PrivateShared *)0x0;
      roleVariant.d.data._8_8_ = anon_var_dwarf_a7ac4;
      roleVariant.d.data._16_8_ = 7;
      _headDataAttribute = (Data *)0x0;
      rhs.m_data = L"Element";
      rhs.m_size = 7;
      bVar6 = ::operator==(QVar11,rhs);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleVariant);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&headDataAttribute);
      if (bVar6) {
        roleVariant.d.data._forAlignment = -NAN;
        roleVariant.d.data._8_8_ = 0;
        roleVariant.d.data._16_8_ = 0;
        bVar7 = readXmlElement(local_a8,reader,(QModelIndex *)&roleVariant);
        if (!bVar7) goto LAB_0012bab5;
        goto LAB_0012b408;
      }
      QVar11 = (QStringView)QXmlStreamReader::name();
      roleVariant.d.data.shared = (PrivateShared *)0x0;
      roleVariant.d.data._8_8_ = anon_var_dwarf_a7b89;
      roleVariant.d.data._16_8_ = 10;
      _headDataAttribute = (Data *)0x0;
      rhs_03.m_data = L"HeaderData";
      rhs_03.m_size = 10;
      bVar6 = ::operator==(QVar11,rhs_03);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleVariant);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&headDataAttribute);
      bVar3 = 1;
    } while (bVar6);
    QVar11 = (QStringView)QXmlStreamReader::name();
    roleVariant.d.data.shared = (PrivateShared *)0x0;
    roleVariant.d.data._8_8_ = anon_var_dwarf_a7bc9;
    roleVariant.d.data._16_8_ = 8;
    _headDataAttribute = (Data *)0x0;
    rhs_04.m_data = L"Vertical";
    rhs_04.m_size = 8;
    bVar6 = ::operator==(QVar11,rhs_04);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleVariant);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&headDataAttribute);
    if ((bVar6 & bVar10) == 1) {
      bVar7 = true;
      bVar6 = bVar8;
    }
    else {
      QVar11 = (QStringView)QXmlStreamReader::name();
      roleVariant.d.data.shared = (PrivateShared *)0x0;
      roleVariant.d.data._8_8_ = anon_var_dwarf_a7b9f;
      roleVariant.d.data._16_8_ = 10;
      _headDataAttribute = (Data *)0x0;
      rhs_05.m_data = L"Horizontal";
      rhs_05.m_size = 10;
      bVar6 = ::operator==(QVar11,rhs_05);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleVariant);
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&headDataAttribute);
      if ((bVar6 & bVar10) != 1) {
        QVar11 = (QStringView)QXmlStreamReader::name();
        roleVariant.d.data.shared = (PrivateShared *)0x0;
        roleVariant.d.data._8_8_ = anon_var_dwarf_a7ba9;
        roleVariant.d.data._16_8_ = 0xf;
        _headDataAttribute = (Data *)0x0;
        rhs_06.m_data = L"HeaderDataPoint";
        rhs_06.m_size = 0xf;
        bVar6 = ::operator==(QVar11,rhs_06);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&roleVariant)
        ;
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)&headDataAttribute);
        bVar3 = bVar10;
        if ((bVar6 & bVar10) == 1) {
          if ((bVar7 == false) && (!bVar8)) {
            return false;
          }
          QXmlStreamReader::attributes();
          roleVariant.d.data.shared = (PrivateShared *)0x0;
          roleVariant.d.data._8_8_ = anon_var_dwarf_a7bbf;
          roleVariant.d.data._16_8_ = 7;
          local_c8.d = (Data *)0x0;
          local_c8.ptr = (char16_t *)0x0;
          local_c8.size = 0;
          bVar6 = QXmlStreamAttributes::hasAttribute(&headDataAttribute,(QString *)&roleVariant);
          if (bVar6) {
            local_a0.d = (Data *)0x0;
            local_a0.ptr = L"Role";
            local_a0.size = 4;
            local_68.d = (Data *)0x0;
            local_68.ptr = (char16_t *)0x0;
            local_68.size = 0;
            bVar6 = QXmlStreamAttributes::hasAttribute(&headDataAttribute,(QString *)&local_a0);
            if (bVar6) {
              local_80.d = (Data *)0x0;
              local_80.ptr = L"Type";
              local_80.size = 4;
              local_48.d = (Data *)0x0;
              local_48.ptr = (char16_t *)0x0;
              local_48.size = 0;
              bVar6 = QXmlStreamAttributes::hasAttribute(&headDataAttribute,(QString *)&local_80);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&roleVariant);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
              if (!bVar6) goto LAB_0012bb8a;
              roleVariant.d.data.shared = (PrivateShared *)0x0;
              roleVariant.d.data._8_8_ = anon_var_dwarf_a7bbf;
              roleVariant.d.data._16_8_ = 7;
              local_c8.d = (Data *)0x0;
              local_c8.ptr = (char16_t *)0x0;
              local_c8.size = 0;
              local_a0._0_16_ = QXmlStreamAttributes::value((QString *)&headDataAttribute);
              local_84 = QStringView::toInt((QStringView *)&local_a0,(bool *)0x0,10);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&roleVariant);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
              roleVariant.d.data.shared = (PrivateShared *)0x0;
              roleVariant.d.data._8_8_ = anon_var_dwarf_a7b6b;
              roleVariant.d.data._16_8_ = 4;
              local_c8.d = (Data *)0x0;
              local_c8.ptr = (char16_t *)0x0;
              local_c8.size = 0;
              QVar11 = (QStringView)QXmlStreamAttributes::value((QString *)&headDataAttribute);
              local_a0._0_16_ = QVar11;
              local_88 = QStringView::toInt((QStringView *)&local_a0,(bool *)0x0,10);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&roleVariant);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
              roleVariant.d.data.shared = (PrivateShared *)0x0;
              roleVariant.d.data._8_8_ = anon_var_dwarf_a7b75;
              roleVariant.d.data._16_8_ = 4;
              local_c8.d = (Data *)0x0;
              local_c8.ptr = (char16_t *)0x0;
              local_c8.size = 0;
              QVar11 = (QStringView)QXmlStreamAttributes::value((QString *)&headDataAttribute);
              local_a0._0_16_ = QVar11;
              type = QStringView::toInt((QStringView *)&local_a0,(bool *)0x0,10);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)&roleVariant);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
              QXmlStreamReader::readElementText(&local_c8,reader,0);
              AbstractStringSerialiserPrivate::loadVariant
                        (&roleVariant,&local_a8->super_AbstractStringSerialiserPrivate,type,
                         (QString *)&local_c8);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
              cVar4 = ::QVariant::isNull();
              if (cVar4 == '\0') {
                pQVar1 = (local_a8->super_AbstractStringSerialiserPrivate).
                         super_AbstractModelSerialiserPrivate.m_model;
                (**(code **)(*(long *)pQVar1 + 0xa8))
                          (pQVar1,local_84,bVar7 + '\x01',(QModelIndex *)&roleVariant,local_88);
              }
              ::QVariant::~QVariant(&roleVariant);
              QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                        ((QArrayDataPointer<QXmlStreamAttribute> *)&headDataAttribute);
              goto LAB_0012b408;
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)&roleVariant);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
LAB_0012bb8a:
          QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                    ((QArrayDataPointer<QXmlStreamAttribute> *)&headDataAttribute);
          return false;
        }
        goto LAB_0012b408;
      }
      bVar8 = true;
      bVar6 = bVar7;
    }
    bVar3 = bVar10;
    bVar5 = bVar7;
    if (bVar6) {
      return false;
    }
  } while( true );
}

Assistant:

bool XmlModelSerialiserPrivate::readXml(QXmlStreamReader &reader)
{
    if (!m_model)
        return false;
    m_model->removeColumns(0, m_model->columnCount());
    m_model->removeRows(0, m_model->rowCount());
    bool headerDataStarted = false;
    bool hHeaderDataStarted = false;
    bool vHeaderDataStarted = false;
    while (!reader.atEnd() && !reader.hasError()) {
        reader.readNext();
        if (reader.isStartElement()) {
            if (reader.name() == QStringLiteral("Element")) {
                if (!readXmlElement(reader)) {
                    m_model->removeColumns(0, m_model->columnCount());
                    m_model->removeRows(0, m_model->rowCount());
                    return false;
                }
            } else if (reader.name() == QStringLiteral("HeaderData")) {
                headerDataStarted = true;
            } else if (reader.name() == QStringLiteral("Vertical") && headerDataStarted) {
                if (hHeaderDataStarted)
                    return false;
                vHeaderDataStarted = true;
            } else if (reader.name() == QStringLiteral("Horizontal") && headerDataStarted) {
                if (vHeaderDataStarted)
                    return false;
                hHeaderDataStarted = true;
            } else if (reader.name() == QStringLiteral("HeaderDataPoint") && headerDataStarted) {
                if (!(vHeaderDataStarted || hHeaderDataStarted))
                    return false;
                const QXmlStreamAttributes headDataAttribute = reader.attributes();
                if (!(headDataAttribute.hasAttribute(QStringLiteral("Section")) && headDataAttribute.hasAttribute(QStringLiteral("Role"))
                      && headDataAttribute.hasAttribute(QStringLiteral("Type"))))
                    return false;
                int headerSection = headDataAttribute.value(QStringLiteral("Section")).toInt();
                int headerRole = headDataAttribute.value(QStringLiteral("Role")).toInt();
                int headerType = headDataAttribute.value(QStringLiteral("Type")).toInt();
                const QVariant roleVariant = loadVariant(headerType, reader.readElementText());
                if (!roleVariant.isNull()) // skip unhandled types
                    m_model->setHeaderData(headerSection, (vHeaderDataStarted ? Qt::Vertical : Qt::Horizontal), roleVariant, headerRole);
            }

        } else if (reader.isEndElement()) {
            if (reader.name() == QStringLiteral("HeaderData")) {
                headerDataStarted = false;
            } else if (reader.name() == QStringLiteral("Vertical") && headerDataStarted) {
                vHeaderDataStarted = false;
            } else if (reader.name() == QStringLiteral("Horizontal") && headerDataStarted) {
                hHeaderDataStarted = false;
            }
        }
    }
    if (reader.hasError()) {
        m_model->removeColumns(0, m_model->columnCount());
        m_model->removeRows(0, m_model->rowCount());
        return false;
    }
    return true;
}